

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safequeue.h
# Opt level: O0

void __thiscall
WaitableSafeQueue<WriterData>::WaitableSafeQueue
          (WaitableSafeQueue<WriterData> *this,uint32_t maxSize)

{
  uint32_t maxSize_local;
  WaitableSafeQueue<WriterData> *this_local;
  
  (this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>._vptr_SafeQueue =
       (_func_int **)&PTR__WaitableSafeQueue_004402b0;
  SafeQueueWithNotification<WriterData>::SafeQueueWithNotification
            (&this->super_SafeQueueWithNotification<WriterData>,maxSize,&this->m_mtx,&this->m_cond);
  (this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>._vptr_SafeQueue =
       (_func_int **)&PTR__WaitableSafeQueue_004402b0;
  std::mutex::mutex(&this->m_mtx);
  std::condition_variable::condition_variable(&this->m_cond);
  return;
}

Assistant:

WaitableSafeQueue(const uint32_t maxSize) : SafeQueueWithNotification<T>(maxSize, m_mtx, m_cond) {}